

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

void VP8LEncoderDelete(VP8LEncoder *enc)

{
  long lVar1;
  
  if (enc != (VP8LEncoder *)0x0) {
    VP8LHashChainClear(&enc->hash_chain_);
    for (lVar1 = 0x868; lVar1 != 0x908; lVar1 = lVar1 + 0x28) {
      VP8LBackwardRefsClear((VP8LBackwardRefs *)((long)enc->palette_ + lVar1 + -0x68));
    }
    ClearTransformBuffer(enc);
    WebPSafeFree(enc);
    return;
  }
  return;
}

Assistant:

static void VP8LEncoderDelete(VP8LEncoder* enc) {
  if (enc != NULL) {
    int i;
    VP8LHashChainClear(&enc->hash_chain_);
    for (i = 0; i < 4; ++i) VP8LBackwardRefsClear(&enc->refs_[i]);
    ClearTransformBuffer(enc);
    WebPSafeFree(enc);
  }
}